

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O1

VCacheData __thiscall VGradientCache::getBuffer(VGradientCache *this,VGradient *gradient)

{
  pthread_mutex_t *__mutex;
  byte bVar1;
  long *plVar2;
  pair<float,_VColor> *ppVar3;
  pair<float,_VColor> *ppVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __buckets_ptr pp_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  int iVar8;
  size_type sVar9;
  _Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
  _Var10;
  long lVar11;
  long in_RDX;
  ulong uVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *plVar13;
  long *plVar14;
  long lVar15;
  pair<std::__detail::_Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>_>
  pVar16;
  VCacheData VVar17;
  VGradient *local_50;
  __buckets_ptr local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  local_50 = (VGradient *)0x0;
  (this->mCache)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->mCache)._M_h._M_bucket_count = 0;
  lVar15 = *(long *)(in_RDX + 0x10);
  lVar11 = *(long *)(in_RDX + 0x18) - lVar15;
  if (lVar11 != 0) {
    local_50 = (VGradient *)0x0;
    uVar12 = 0;
    do {
      bVar1 = *(byte *)(lVar15 + 4 + uVar12 * 8);
      local_50 = (VGradient *)
                 ((long)&local_50->mType +
                 (long)((float)(((uint)*(byte *)(lVar15 + 6 + uVar12 * 8) * (uint)bVar1) / 0xff << 8
                                | ((uint)*(byte *)(lVar15 + 7 + uVar12 * 8) * (uint)bVar1) / 0xff |
                               ((uint)*(byte *)(lVar15 + 5 + uVar12 * 8) * (uint)bVar1) / 0xff <<
                               0x10 | (uint)bVar1 << 0x18) * *(float *)(in_RDX + 0x28)));
      if (1 < uVar12) break;
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)(lVar11 >> 3));
  }
  __mutex = (pthread_mutex_t *)((long)&gradient->field_5 + 0xc);
  iVar8 = pthread_mutex_lock(__mutex);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  sVar9 = std::
          _Hashtable<long,_std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::count((_Hashtable<long,_std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   *)gradient,(key_type *)&local_50);
  if (sVar9 != 0) {
    if (sVar9 == 1) {
      uVar12 = (ulong)local_50 % *(ulong *)&gradient->mMode;
      plVar13 = *(long **)(*(long *)gradient + uVar12 * 8);
      plVar14 = (long *)0x0;
      if ((plVar13 != (long *)0x0) &&
         (plVar2 = (long *)*plVar13, plVar14 = plVar13,
         local_50 != (VGradient *)((long *)*plVar13)[1])) {
        while (plVar13 = plVar2, plVar2 = (long *)*plVar13, plVar2 != (long *)0x0) {
          plVar14 = (long *)0x0;
          if (((ulong)plVar2[1] % *(ulong *)&gradient->mMode != uVar12) ||
             (plVar14 = plVar13, local_50 == (VGradient *)plVar2[1])) goto LAB_0010fd8c;
        }
        plVar14 = (long *)0x0;
      }
LAB_0010fd8c:
      if (plVar14 == (long *)0x0) {
        lVar15 = 0;
      }
      else {
        lVar15 = *plVar14;
      }
      ppVar3 = *(pair<float,_VColor> **)(*(long *)(lVar15 + 0x10) + 0x1008);
      ppVar4 = *(pair<float,_VColor> **)(*(long *)(lVar15 + 0x10) + 0x1010);
      if (((long)ppVar4 - (long)ppVar3 ==
           *(long *)(in_RDX + 0x18) - (long)*(pair<float,_VColor> **)(in_RDX + 0x10)) &&
         (bVar7 = std::__equal<false>::
                  equal<std::pair<float,VColor>const*,std::pair<float,VColor>const*>
                            (ppVar3,ppVar4,*(pair<float,_VColor> **)(in_RDX + 0x10)), bVar7)) {
        (this->mCache)._M_h._M_buckets = *(__buckets_ptr *)(lVar15 + 0x10);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &(this->mCache)._M_h._M_bucket_count,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar15 + 0x18));
        goto LAB_0010fe2b;
      }
    }
    else {
      pVar16 = std::
               _Hashtable<long,_std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
               ::equal_range((_Hashtable<long,_std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                              *)gradient,(key_type *)&local_50);
      for (_Var10._M_cur =
                (__node_type *)
                pVar16.first.
                super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
                ._M_cur;
          (_Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
           )_Var10._M_cur !=
          pVar16.second.
          super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
          ._M_cur.
          super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
          ; _Var10._M_cur = (__node_type *)((_Var10._M_cur)->super__Hash_node_base)._M_nxt) {
        lVar15 = *(long *)((long)&((_Var10._M_cur)->
                                  super__Hash_node_value<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>
                                  ._M_storage._M_storage + 8);
        ppVar3 = *(pair<float,_VColor> **)(lVar15 + 0x1008);
        ppVar4 = *(pair<float,_VColor> **)(lVar15 + 0x1010);
        if (((long)ppVar4 - (long)ppVar3 ==
             *(long *)(in_RDX + 0x18) - (long)*(pair<float,_VColor> **)(in_RDX + 0x10)) &&
           (bVar7 = std::__equal<false>::
                    equal<std::pair<float,VColor>const*,std::pair<float,VColor>const*>
                              (ppVar3,ppVar4,*(pair<float,_VColor> **)(in_RDX + 0x10)), bVar7)) {
          (this->mCache)._M_h._M_buckets =
               *(__buckets_ptr *)
                ((long)&((_Var10._M_cur)->
                        super__Hash_node_value<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>
                        ._M_storage._M_storage + 8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &(this->mCache)._M_h._M_bucket_count,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&((_Var10._M_cur)->
                             super__Hash_node_value<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>
                             ._M_storage._M_storage + 0x10));
          break;
        }
      }
      if ((this->mCache)._M_h._M_buckets != (__buckets_ptr)0x0) goto LAB_0010fe2b;
    }
  }
  addCacheElement((VGradientCache *)&stack0xffffffffffffffb8,(VCacheKey)gradient,local_50);
  p_Var6 = p_Stack_40;
  pp_Var5 = local_48;
  local_48 = (__buckets_ptr)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->mCache)._M_h._M_bucket_count;
  (this->mCache)._M_h._M_buckets = pp_Var5;
  (this->mCache)._M_h._M_bucket_count = (size_type)p_Var6;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
LAB_0010fe2b:
  pthread_mutex_unlock(__mutex);
  VVar17.super___shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  VVar17.super___shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VCacheData)
         VVar17.super___shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VCacheData getBuffer(const VGradient &gradient)
    {
        VCacheKey             hash_val = 0;
        VCacheData            info;
        const VGradientStops &stops = gradient.mStops;
        for (uint32_t i = 0; i < stops.size() && i <= 2; i++)
            hash_val +=
                VCacheKey(stops[i].second.premulARGB() * gradient.alpha());

        {
            std::lock_guard<std::mutex> guard(mMutex);

            size_t count = mCache.count(hash_val);
            if (!count) {
                // key is not present in the hash
                info = addCacheElement(hash_val, gradient);
            } else if (count == 1) {
                auto search = mCache.find(hash_val);
                if (search->second->stops == stops) {
                    info = search->second;
                } else {
                    // didn't find an exact match
                    info = addCacheElement(hash_val, gradient);
                }
            } else {
                // we have a multiple data with same key
                auto range = mCache.equal_range(hash_val);
                for (auto it = range.first; it != range.second; ++it) {
                    if (it->second->stops == stops) {
                        info = it->second;
                        break;
                    }
                }
                if (!info) {
                    // didn't find an exact match
                    info = addCacheElement(hash_val, gradient);
                }
            }
        }
        return info;
    }